

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O0

int mbedtls_aesni_crypt_ecb(mbedtls_aes_context *ctx,int mode,uchar *input,uchar *output)

{
  int iVar1;
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  uchar *output_local;
  uchar *input_local;
  int mode_local;
  mbedtls_aes_context *ctx_local;
  
  auVar3 = *(undefined1 (*) [16])input ^ *(undefined1 (*) [16])ctx->rk;
  pauVar2 = (undefined1 (*) [16])ctx->rk + 1;
  iVar1 = ctx->nr + -1;
  if (mode == 0) {
    do {
      auVar3 = aesdec(auVar3,*pauVar2);
      pauVar2 = pauVar2 + 1;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    auVar3 = aesdeclast(auVar3,*pauVar2);
  }
  else {
    do {
      auVar3 = aesenc(auVar3,*pauVar2);
      pauVar2 = pauVar2 + 1;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    auVar3 = aesenclast(auVar3,*pauVar2);
  }
  *(undefined1 (*) [16])output = auVar3;
  return 0;
}

Assistant:

int mbedtls_aesni_crypt_ecb( mbedtls_aes_context *ctx,
                     int mode,
                     const unsigned char input[16],
                     unsigned char output[16] )
{
    asm( "movdqu    (%3), %%xmm0    \n\t" // load input
         "movdqu    (%1), %%xmm1    \n\t" // load round key 0
         "pxor      %%xmm1, %%xmm0  \n\t" // round 0
         "addq      $16, %1         \n\t" // point to next round key
         "subl      $1, %0          \n\t" // normal rounds = nr - 1
         "test      %2, %2          \n\t" // mode?
         "jz        2f              \n\t" // 0 = decrypt

         "1:                        \n\t" // encryption loop
         "movdqu    (%1), %%xmm1    \n\t" // load round key
         AESENC     xmm1_xmm0      "\n\t" // do round
         "addq      $16, %1         \n\t" // point to next round key
         "subl      $1, %0          \n\t" // loop
         "jnz       1b              \n\t"
         "movdqu    (%1), %%xmm1    \n\t" // load round key
         AESENCLAST xmm1_xmm0      "\n\t" // last round
         "jmp       3f              \n\t"

         "2:                        \n\t" // decryption loop
         "movdqu    (%1), %%xmm1    \n\t"
         AESDEC     xmm1_xmm0      "\n\t" // do round
         "addq      $16, %1         \n\t"
         "subl      $1, %0          \n\t"
         "jnz       2b              \n\t"
         "movdqu    (%1), %%xmm1    \n\t" // load round key
         AESDECLAST xmm1_xmm0      "\n\t" // last round

         "3:                        \n\t"
         "movdqu    %%xmm0, (%4)    \n\t" // export output
         :
         : "r" (ctx->nr), "r" (ctx->rk), "r" (mode), "r" (input), "r" (output)
         : "memory", "cc", "xmm0", "xmm1" );


    return( 0 );
}